

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::type(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  Char CVar1;
  uint uVar2;
  uint index;
  undefined8 in_RAX;
  ulong uVar3;
  char ch;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  requireDStackDepth(this,2,"TYPE");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  index = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (uVar2 != 0) {
    uVar3 = (ulong)uVar2 + 1;
    do {
      CVar1 = dataSpaceAt(this,index);
      uStack_38 = CONCAT17(CVar1,(undefined7)uStack_38);
      if (this->writeToTarget == ToStdCout) {
        std::ostream::write((char *)&std::cout,(long)&uStack_38 + 7);
        std::ostream::flush();
      }
      else if (this->writeToTarget == ToString) {
        std::ostream::write(&this->field_0x20,(long)&uStack_38 + 7);
      }
      uVar3 = uVar3 - 1;
      index = index + 1;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

void type() {
			REQUIRE_DSTACK_DEPTH(2, "TYPE");
			auto length = static_cast<std::streamsize>(dStack.getTop()); pop();
			auto caddr = CADDR(dStack.getTop()); pop();
			while (length-- > 0){
				char ch = dataSpaceAt(caddr++);
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
				switch (writeToTarget) {
				case ToString:
					std_cout.write(&ch, 1);
					break;
				case ToStdCout:
					std::cout.write(&ch, 1);
				    std::cout.flush();
					break;
				default:
					break;
				}
#endif
			}
		}